

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

string * __thiscall
SchemeString::printable_abi_cxx11_(string *__return_storage_ptr__,SchemeString *this)

{
  SchemeString *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->value);
  return __return_storage_ptr__;
}

Assistant:

std::string SchemeString::printable() const
{
    return value;
}